

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O2

bool FIX::Message::isAdminMsgType(MsgType *msgType)

{
  void *pvVar1;
  
  if ((msgType->super_StringField).super_FieldBase.m_string._M_string_length == 1) {
    pvVar1 = memchr("0A12345",
                    (int)*(msgType->super_StringField).super_FieldBase.m_string._M_dataplus._M_p,8);
    return pvVar1 != (void *)0x0;
  }
  return false;
}

Assistant:

static bool isAdminMsgType( const MsgType& msgType )
  { if ( msgType.getValue().length() != 1 ) return false;
    return strchr
           ( "0A12345",
             msgType.getValue().c_str() [ 0 ] ) != 0;
  }